

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

MMAL_FOURCC_T __thiscall
raspicam::_private::Private_Impl_Still::convertEncoding
          (Private_Impl_Still *this,RASPICAM_ENCODING encoding)

{
  if (encoding < (RASPICAM_ENCODING_RGB|RASPICAM_ENCODING_BMP)) {
    return *(MMAL_FOURCC_T *)(&DAT_0010cbcc + (ulong)encoding * 4);
  }
  return 0xffffffff;
}

Assistant:

MMAL_FOURCC_T Private_Impl_Still::convertEncoding ( RASPICAM_ENCODING encoding ) {
            switch ( encoding ) {
            case RASPICAM_ENCODING_JPEG:
                return MMAL_ENCODING_JPEG;
            case RASPICAM_ENCODING_BMP:
                return MMAL_ENCODING_BMP;
            case RASPICAM_ENCODING_GIF:
                return MMAL_ENCODING_GIF;
            case RASPICAM_ENCODING_PNG:
                return MMAL_ENCODING_PNG;
            case RASPICAM_ENCODING_RGB:
                return MMAL_ENCODING_BMP;
            default:
                return -1;
            }
        }